

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TexelFetchDecodeSkippedcase::verifyResult
          (TexelFetchDecodeSkippedcase *this)

{
  float fVar1;
  TestLog *pTVar2;
  ulong uVar3;
  deUint32 dVar4;
  int i;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<float,_4> res;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vector<float,_4> res_1;
  char local_210 [8];
  long *local_208;
  long lStack_200;
  long local_1f8 [3];
  float local_1e0;
  float local_1dc;
  float local_1d8 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1c8;
  Vec4 local_1a8;
  undefined1 local_198 [8];
  _func_int **pp_Stack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  pTVar2 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&local_1c8);
  dVar4 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  local_1dc = 0.0;
  local_1e0 = 0.0;
  if (dVar4 != 0x8fbd) {
    local_1e0 = 0.3;
    local_1dc = 0.4;
  }
  local_1d8[1] = local_1e0;
  local_1d8[0] = 0.2;
  local_1d8[3] = 1.0;
  local_1d8[2] = local_1dc;
  local_198 = (undefined1  [8])local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Expected color: ","");
  local_1a8.m_data[0] = 0.2;
  local_1a8.m_data[1] = local_1e0;
  local_1a8.m_data[2] = local_1dc;
  local_1a8.m_data[3] = 1.0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,0,&local_1a8);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
  }
  local_208 = (long *)0x0;
  lStack_200 = 0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_208 + lVar5 * 4) =
         (local_1c8.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start)->m_data[lVar5] - local_1d8[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_198 = (undefined1  [8])0x0;
  pp_Stack_190 = (_func_int **)0x0;
  lVar5 = 0;
  do {
    fVar1 = *(float *)((long)&local_208 + lVar5 * 4);
    fVar8 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar8 = fVar1;
    }
    *(float *)(local_198 + lVar5 * 4) = fVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_210[4] = '\0';
  local_210[5] = '\0';
  local_210[6] = '\0';
  local_210[7] = '\0';
  lVar5 = 0;
  do {
    fVar1 = (this->super_SRGBTestCase).m_epsilonError.m_data[lVar5];
    local_210[lVar5 + 4] =
         *(float *)(local_198 + lVar5 * 4) <= fVar1 && fVar1 != *(float *)(local_198 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_198 = (undefined1  [8])pTVar2;
  if (local_210[4] == '\0') {
LAB_014b7d0c:
    local_210[0] = '\0';
    local_210[1] = '\0';
    local_210[2] = '\0';
    local_210[3] = '\0';
    lVar5 = 0;
    do {
      local_210[lVar5] =
           (local_1c8.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->m_data[lVar5] == local_1d8[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (local_210[0] != '\0') {
      uVar3 = 0;
      do {
        uVar6 = uVar3;
        if (uVar6 == 3) break;
        uVar3 = uVar6 + 1;
      } while (local_210[uVar6 + 1] != '\0');
      if (2 < uVar6) goto LAB_014b7d63;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"not linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_190,(char *)local_208,lStack_200);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_190);
    std::ios_base::~ios_base(local_120);
    bVar7 = false;
  }
  else {
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      if (uVar6 == 3) break;
      uVar3 = uVar6 + 1;
    } while (local_210[uVar6 + 5] != '\0');
    if (uVar6 < 3) goto LAB_014b7d0c;
LAB_014b7d63:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_190,(char *)local_208,lStack_200);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_190);
    std::ios_base::~ios_base(local_120);
    bVar7 = true;
  }
  if (local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool TexelFetchDecodeSkippedcase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelReference = pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be linear due to automatic conversion via texelFetch*(). Compare with linear reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelResultList[0] - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelResultList[0], pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}